

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

vector<OpTpl_*,_std::allocator<OpTpl_*>_> * __thiscall
PcodeCompile::newOutput
          (PcodeCompile *this,bool usesLocalKey,ExprTree *rhs,string *varname,uint4 size)

{
  string *nm;
  string *psVar1;
  const_type cVar2;
  int iVar3;
  VarnodeTpl *pVVar4;
  ConstTpl *pCVar5;
  AddrSpace *base;
  uintb uVar6;
  uintb uVar7;
  undefined4 extraout_var;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar8;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [48];
  ConstTpl local_60;
  VarnodeTpl *local_40;
  VarnodeTpl *tmpvn;
  VarnodeSymbol *sym;
  string *psStack_28;
  uint4 size_local;
  string *varname_local;
  ExprTree *rhs_local;
  PcodeCompile *pPStack_10;
  bool usesLocalKey_local;
  PcodeCompile *this_local;
  
  sym._4_4_ = size;
  psStack_28 = varname;
  varname_local = (string *)rhs;
  rhs_local._7_1_ = usesLocalKey;
  pPStack_10 = this;
  pVVar4 = buildTemporary(this);
  local_40 = pVVar4;
  if (sym._4_4_ == 0) {
    pCVar5 = ExprTree::getSize((ExprTree *)varname_local);
    cVar2 = ConstTpl::getType(pCVar5);
    if (cVar2 == real) {
      pCVar5 = ExprTree::getSize((ExprTree *)varname_local);
      uVar6 = ConstTpl::getReal(pCVar5);
      pVVar4 = local_40;
      if (uVar6 != 0) {
        pCVar5 = ExprTree::getSize((ExprTree *)varname_local);
        VarnodeTpl::setSize(pVVar4,pCVar5);
      }
    }
  }
  else {
    ConstTpl::ConstTpl(&local_60,real,(ulong)sym._4_4_);
    VarnodeTpl::setSize(pVVar4,&local_60);
  }
  ExprTree::setOutput((ExprTree *)varname_local,local_40);
  pVVar4 = (VarnodeTpl *)operator_new(0x58);
  nm = psStack_28;
  pCVar5 = VarnodeTpl::getSpace(local_40);
  base = ConstTpl::getSpace(pCVar5);
  pCVar5 = VarnodeTpl::getOffset(local_40);
  uVar6 = ConstTpl::getReal(pCVar5);
  pCVar5 = VarnodeTpl::getSize(local_40);
  uVar7 = ConstTpl::getReal(pCVar5);
  VarnodeSymbol::VarnodeSymbol((VarnodeSymbol *)pVVar4,nm,base,uVar6,(int4)uVar7);
  tmpvn = pVVar4;
  (*this->_vptr_PcodeCompile[1])(this,pVVar4);
  if (((rhs_local._7_1_ & 1) == 0) && ((this->enforceLocalKey & 1U) != 0)) {
    iVar3 = (*this->_vptr_PcodeCompile[4])(this,tmpvn);
    std::operator+((char *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Must use \'local\' keyword to define symbol \'");
    std::operator+(local_90,(char *)local_b0);
    (*this->_vptr_PcodeCompile[5])(this,CONCAT44(extraout_var,iVar3),local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_b0);
  }
  psVar1 = (string *)psStack_28;
  if (psStack_28 != (string *)0x0) {
    std::__cxx11::string::~string((string *)psStack_28);
    operator_delete(psVar1);
  }
  pvVar8 = ExprTree::toVector((ExprTree *)varname_local);
  return pvVar8;
}

Assistant:

vector<OpTpl *> *PcodeCompile::newOutput(bool usesLocalKey,ExprTree *rhs,string *varname,uint4 size)

{
  VarnodeSymbol *sym;
  VarnodeTpl *tmpvn = buildTemporary();
  if (size != 0)
    tmpvn->setSize(ConstTpl(ConstTpl::real,size)); // Size was explicitly specified
  else if ((rhs->getSize().getType()==ConstTpl::real)&&(rhs->getSize().getReal()!=0))
    tmpvn->setSize(rhs->getSize());	// Inherit size from unnamed expression result
				// Only inherit if the size is real, otherwise we
				// cannot build the VarnodeSymbol with a placeholder constant
  rhs->setOutput(tmpvn);
  sym = new VarnodeSymbol(*varname,tmpvn->getSpace().getSpace(),tmpvn->getOffset().getReal(),tmpvn->getSize().getReal()); // Create new symbol regardless
  addSymbol(sym);
  if ((!usesLocalKey) && enforceLocalKey)
    reportError(getLocation(sym), "Must use 'local' keyword to define symbol '"+*varname + "'");
  delete varname;
  return ExprTree::toVector(rhs);
}